

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O2

void __thiscall CFFPrimitiveWriter::SetStream(CFFPrimitiveWriter *this,IByteWriter *inCFFOutput)

{
  EStatusCode EVar1;
  
  this->mCFFOutput = inCFFOutput;
  if (inCFFOutput == (IByteWriter *)0x0) {
    EVar1 = eFailure;
  }
  else {
    this->mCurrentOffsize = '\x01';
    EVar1 = eSuccess;
  }
  this->mInternalState = EVar1;
  return;
}

Assistant:

void CFFPrimitiveWriter::SetStream(IByteWriter* inCFFOutput)
{
	mCFFOutput = inCFFOutput;
	if(inCFFOutput)
	{
		mCurrentOffsize = 1;
		mInternalState = PDFHummus::eSuccess;
	}
	else
	{
		mInternalState = PDFHummus::eFailure;
	}
}